

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int tostringbuff(TValue *obj,char *buff)

{
  size_t sVar1;
  lconv *plVar2;
  int iVar3;
  int local_1c;
  int len;
  char *buff_local;
  TValue *obj_local;
  
  if (obj->tt_ == '\x03') {
    local_1c = snprintf(buff,0x2c,"%lld",(obj->value_).gc);
  }
  else {
    local_1c = snprintf(buff,0x2c,"%.14g",(obj->value_).gc);
    sVar1 = strspn(buff,"-0123456789");
    if (buff[sVar1] == '\0') {
      plVar2 = localeconv();
      iVar3 = local_1c + 1;
      buff[local_1c] = *plVar2->decimal_point;
      local_1c = local_1c + 2;
      buff[iVar3] = '0';
    }
  }
  return local_1c;
}

Assistant:

static int tostringbuff (TValue *obj, char *buff) {
  int len;
  lua_assert(ttisnumber(obj));
  if (ttisinteger(obj))
    len = lua_integer2str(buff, MAXNUMBER2STR, ivalue(obj));
  else {
    len = lua_number2str(buff, MAXNUMBER2STR, fltvalue(obj));
    if (buff[strspn(buff, "-0123456789")] == '\0') {  /* looks like an int? */
      buff[len++] = lua_getlocaledecpoint();
      buff[len++] = '0';  /* adds '.0' to result */
    }
  }
  return len;
}